

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

AssertionExpr *
slang::ast::bindAssertionBody
          (Symbol *symbol,SyntaxNode *syntax,ASTContext *context,SourceLocation outputLocalVarArgLoc
          ,AssertionInstanceDetails *instance,SmallVectorBase<const_slang::ast::Symbol_*> *localVars
          )

{
  size_t *psVar1;
  pointer ppLVar2;
  group_type_pointer pgVar3;
  SymbolKind SVar4;
  SyntaxNode *pSVar5;
  group_type_pointer pgVar6;
  value_type_pointer ppVar7;
  ulong uVar8;
  uint uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  byte bVar13;
  SyntaxKind *pSVar14;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar15;
  bool bVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  Scope *this;
  uint64_t uVar20;
  Symbol *pSVar21;
  undefined4 extraout_var;
  Diagnostic *this_01;
  undefined4 extraout_var_00;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t extraout_EDX_01;
  socklen_t extraout_EDX_02;
  socklen_t extraout_EDX_03;
  socklen_t extraout_EDX_04;
  socklen_t extraout_EDX_05;
  socklen_t __len;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  SyntaxNode *pSVar27;
  string_view *psVar28;
  value_type_pointer ppVar29;
  AssertionInstanceDetails *pAVar30;
  pointer ppLVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  SourceRange sourceRange;
  try_emplace_args_t local_159;
  LocalAssertionVarSymbol *var;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_150;
  AssertionInstanceDetails *local_148;
  SyntaxNode *local_140;
  SyntaxNode *local_138;
  group_type_pointer local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  uint64_t local_108;
  ulong local_100;
  ASTContext *local_f8;
  SmallVector<const_slang::ast::LocalAssertionVarSymbol_*,_5UL> vars;
  locator res;
  AssertionExpr *this_00;
  
  SVar4 = symbol->kind;
  local_148 = instance;
  this = Symbol::scopeOrNull(symbol);
  pSVar27 = syntax[7].parent;
  pSVar5 = syntax[7].previewNode;
  pSVar14 = &pSVar27->kind;
  local_138 = syntax;
  if (SVar4 == Sequence) {
    if (pSVar5 != (SyntaxNode *)0x0) {
      local_150 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  &local_148->localVars;
      pAVar30 = local_148;
      do {
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ =
             (pointer)vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                      firstElement;
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len = 0;
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.cap = 5;
        LocalAssertionVarSymbol::fromSyntax
                  ((context->scope).ptr,*(LocalVariableDeclarationSyntax **)pSVar27,
                   &vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>);
        if (vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len != 0) {
          ppLVar2 = vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ +
                    vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len;
          ppLVar31 = vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_;
          local_140 = pSVar27;
          do {
            var = *ppLVar31;
            DeclaredType::forceResolveAt
                      (&(var->super_VariableSymbol).super_ValueSymbol.declaredType,context);
            phVar15 = local_150;
            if ((var->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len != 0) {
              psVar28 = &(var->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
              uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 (local_150,psVar28);
              uVar25 = uVar20 >> ((byte)*phVar15 & 0x3f);
              lVar23 = (uVar20 & 0xff) * 4;
              uVar10 = (&UNK_0050901c)[lVar23];
              uVar11 = (&UNK_0050901d)[lVar23];
              uVar12 = (&UNK_0050901e)[lVar23];
              bVar13 = (&UNK_0050901f)[lVar23];
              uVar22 = (ulong)((uint)uVar20 & 7);
              uVar24 = 0;
              uVar26 = uVar25;
              do {
                pgVar6 = (pAVar30->localVars).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                         .arrays.groups_;
                pgVar3 = pgVar6 + uVar25;
                bVar17 = pgVar3->m[0xf].n;
                auVar32[0] = -(pgVar3->m[0].n == uVar10);
                auVar32[1] = -(pgVar3->m[1].n == uVar11);
                auVar32[2] = -(pgVar3->m[2].n == uVar12);
                auVar32[3] = -(pgVar3->m[3].n == bVar13);
                auVar32[4] = -(pgVar3->m[4].n == uVar10);
                auVar32[5] = -(pgVar3->m[5].n == uVar11);
                auVar32[6] = -(pgVar3->m[6].n == uVar12);
                auVar32[7] = -(pgVar3->m[7].n == bVar13);
                auVar32[8] = -(pgVar3->m[8].n == uVar10);
                auVar32[9] = -(pgVar3->m[9].n == uVar11);
                auVar32[10] = -(pgVar3->m[10].n == uVar12);
                auVar32[0xb] = -(pgVar3->m[0xb].n == bVar13);
                auVar32[0xc] = -(pgVar3->m[0xc].n == uVar10);
                auVar32[0xd] = -(pgVar3->m[0xd].n == uVar11);
                auVar32[0xe] = -(pgVar3->m[0xe].n == uVar12);
                auVar32[0xf] = -(bVar17 == bVar13);
                uVar18 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
                if (uVar18 != 0) {
                  local_130 = pgVar6 + uVar25;
                  ppVar7 = (pAVar30->localVars).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                           .arrays.elements_;
                  local_128 = uVar24;
                  local_120 = uVar25;
                  local_118 = uVar22;
                  local_110 = uVar26;
                  local_108 = uVar20;
                  do {
                    local_100 = (ulong)uVar18;
                    uVar9 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                      }
                    }
                    ppVar29 = ppVar7 + uVar25 * 0xf + (ulong)uVar9;
                    bVar16 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                             operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)local_150,psVar28,&ppVar29->first);
                    if (bVar16) {
                      Scope::reportNameConflict((context->scope).ptr,(Symbol *)var,ppVar29->second);
                      pAVar30 = local_148;
                      goto LAB_004a3c53;
                    }
                    uVar18 = (uint)local_100 - 1 & (uint)local_100;
                  } while (uVar18 != 0);
                  bVar17 = local_130->m[0xf].n;
                  uVar22 = local_118;
                  uVar25 = local_120;
                  uVar24 = local_128;
                  uVar20 = local_108;
                  uVar26 = local_110;
                  pAVar30 = local_148;
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[uVar22] & bVar17) == 0) break;
                uVar8 = (pAVar30->localVars).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                        .arrays.groups_size_mask;
                lVar23 = uVar25 + uVar24;
                uVar24 = uVar24 + 1;
                uVar25 = lVar23 + 1U & uVar8;
              } while (uVar24 <= uVar8);
              if ((pAVar30->localVars).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                  .size_ctrl.size <
                  (pAVar30->localVars).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                  .size_ctrl.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                          (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                                 *)local_150,(arrays_type *)local_150,uVar26,uVar20,&local_159,
                           psVar28,&var);
                psVar1 = &(pAVar30->localVars).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                          .size_ctrl.size;
                *psVar1 = *psVar1 + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                          (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                                 *)local_150,uVar20,&local_159,psVar28,&var);
              }
              res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)var;
              SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                        ((SmallVectorBase<slang::ast::Symbol_const*> *)localVars,(Symbol **)&res);
              pSVar21 = Scope::find(this,(var->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                                         name);
              if (pSVar21 != (Symbol *)0x0) {
                Scope::reportNameConflict((context->scope).ptr,(Symbol *)var,pSVar21);
              }
            }
LAB_004a3c53:
            ppLVar31 = ppLVar31 + 1;
            pSVar27 = local_140;
          } while (ppLVar31 != ppLVar2);
        }
        if (vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ !=
            (pointer)vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                     firstElement) {
          operator_delete(vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                          data_);
        }
        pSVar27 = (SyntaxNode *)&pSVar27->parent;
      } while (pSVar27 != (SyntaxNode *)(pSVar14 + (long)pSVar5 * 2));
    }
    iVar19 = AssertionExpr::bind((int)*(undefined8 *)(local_138 + 8),(sockaddr *)context,0);
    this_00 = (AssertionExpr *)CONCAT44(extraout_var,iVar19);
    AssertionExpr::requireSequence(this_00,context);
    if ((((ulong)outputLocalVarArgLoc & 0xfffffff) != 0) &&
       (AssertionExpr::checkNondegeneracy((NondegeneracyCheckResult *)&vars,this_00),
       ((ulong)vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ & 1) !=
       0)) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(local_138 + 8));
      this_01 = ASTContext::addDiag(context,(DiagCode)0x6c0007,sourceRange);
      Diagnostic::operator<<(this_01,symbol->name);
      Diagnostic::addNote(this_01,(DiagCode)0x50001,outputLocalVarArgLoc);
    }
  }
  else {
    __len = extraout_EDX;
    if (pSVar5 != (SyntaxNode *)0x0) {
      local_150 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  &local_148->localVars;
      pAVar30 = local_148;
      local_f8 = context;
      do {
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ =
             (pointer)vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                      firstElement;
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len = 0;
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.cap = 5;
        LocalAssertionVarSymbol::fromSyntax
                  ((context->scope).ptr,*(LocalVariableDeclarationSyntax **)pSVar27,
                   &vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>);
        __len = extraout_EDX_00;
        if (vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len != 0) {
          ppLVar2 = vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ +
                    vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len;
          ppLVar31 = vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_;
          local_140 = pSVar27;
          do {
            var = *ppLVar31;
            DeclaredType::forceResolveAt
                      (&(var->super_VariableSymbol).super_ValueSymbol.declaredType,context);
            phVar15 = local_150;
            __len = extraout_EDX_01;
            if ((var->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len != 0) {
              psVar28 = &(var->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
              uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 (local_150,psVar28);
              uVar25 = uVar20 >> ((byte)*phVar15 & 0x3f);
              lVar23 = (uVar20 & 0xff) * 4;
              uVar10 = (&UNK_0050901c)[lVar23];
              uVar11 = (&UNK_0050901d)[lVar23];
              uVar12 = (&UNK_0050901e)[lVar23];
              bVar13 = (&UNK_0050901f)[lVar23];
              uVar22 = (ulong)((uint)uVar20 & 7);
              uVar24 = 0;
              uVar26 = uVar25;
              do {
                context = local_f8;
                pgVar6 = (pAVar30->localVars).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                         .arrays.groups_;
                pgVar3 = pgVar6 + uVar25;
                bVar17 = pgVar3->m[0xf].n;
                auVar33[0] = -(pgVar3->m[0].n == uVar10);
                auVar33[1] = -(pgVar3->m[1].n == uVar11);
                auVar33[2] = -(pgVar3->m[2].n == uVar12);
                auVar33[3] = -(pgVar3->m[3].n == bVar13);
                auVar33[4] = -(pgVar3->m[4].n == uVar10);
                auVar33[5] = -(pgVar3->m[5].n == uVar11);
                auVar33[6] = -(pgVar3->m[6].n == uVar12);
                auVar33[7] = -(pgVar3->m[7].n == bVar13);
                auVar33[8] = -(pgVar3->m[8].n == uVar10);
                auVar33[9] = -(pgVar3->m[9].n == uVar11);
                auVar33[10] = -(pgVar3->m[10].n == uVar12);
                auVar33[0xb] = -(pgVar3->m[0xb].n == bVar13);
                auVar33[0xc] = -(pgVar3->m[0xc].n == uVar10);
                auVar33[0xd] = -(pgVar3->m[0xd].n == uVar11);
                auVar33[0xe] = -(pgVar3->m[0xe].n == uVar12);
                auVar33[0xf] = -(bVar17 == bVar13);
                uVar18 = (uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe);
                if (uVar18 != 0) {
                  local_130 = pgVar6 + uVar25;
                  ppVar7 = (pAVar30->localVars).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                           .arrays.elements_;
                  local_128 = uVar24;
                  local_120 = uVar25;
                  local_118 = uVar22;
                  local_110 = uVar26;
                  local_108 = uVar20;
                  do {
                    local_100 = (ulong)uVar18;
                    uVar9 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                      }
                    }
                    ppVar29 = ppVar7 + uVar25 * 0xf + (ulong)uVar9;
                    bVar16 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                             operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)local_150,psVar28,&ppVar29->first);
                    if (bVar16) {
                      Scope::reportNameConflict((context->scope).ptr,(Symbol *)var,ppVar29->second);
                      pSVar27 = local_140;
                      pAVar30 = local_148;
                      __len = extraout_EDX_04;
                      goto LAB_004a3feb;
                    }
                    uVar18 = (uint)local_100 - 1 & (uint)local_100;
                  } while (uVar18 != 0);
                  bVar17 = local_130->m[0xf].n;
                  uVar22 = local_118;
                  uVar25 = local_120;
                  uVar24 = local_128;
                  uVar20 = local_108;
                  uVar26 = local_110;
                  pAVar30 = local_148;
                }
                pSVar27 = local_140;
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[uVar22] & bVar17) == 0) break;
                uVar8 = (pAVar30->localVars).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                        .arrays.groups_size_mask;
                lVar23 = uVar25 + uVar24;
                uVar24 = uVar24 + 1;
                uVar25 = lVar23 + 1U & uVar8;
              } while (uVar24 <= uVar8);
              if ((pAVar30->localVars).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                  .size_ctrl.size <
                  (pAVar30->localVars).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                  .size_ctrl.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                          (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                                 *)local_150,(arrays_type *)local_150,uVar26,uVar20,&local_159,
                           psVar28,&var);
                psVar1 = &(pAVar30->localVars).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                          .size_ctrl.size;
                *psVar1 = *psVar1 + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                          (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                                 *)local_150,uVar20,&local_159,psVar28,&var);
              }
              context = local_f8;
              res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)var;
              SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                        ((SmallVectorBase<slang::ast::Symbol_const*> *)localVars,(Symbol **)&res);
              pSVar21 = Scope::find(this,(var->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                                         name);
              __len = extraout_EDX_02;
              if (pSVar21 != (Symbol *)0x0) {
                Scope::reportNameConflict((context->scope).ptr,(Symbol *)var,pSVar21);
                __len = extraout_EDX_03;
              }
            }
LAB_004a3feb:
            ppLVar31 = ppLVar31 + 1;
          } while (ppLVar31 != ppLVar2);
        }
        if (vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ !=
            (pointer)vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                     firstElement) {
          operator_delete(vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                          data_);
          __len = extraout_EDX_05;
        }
        pSVar27 = (SyntaxNode *)&pSVar27->parent;
      } while (pSVar27 != (SyntaxNode *)(pSVar14 + (long)pSVar5 * 2));
    }
    iVar19 = AssertionExpr::bind((int)*(undefined8 *)(local_138 + 8),(sockaddr *)context,__len);
    this_00 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar19);
  }
  return this_00;
}

Assistant:

static const AssertionExpr& bindAssertionBody(const Symbol& symbol, const SyntaxNode& syntax,
                                              const ASTContext& context,
                                              SourceLocation outputLocalVarArgLoc,
                                              AssertionInstanceDetails& instance,
                                              SmallVectorBase<const Symbol*>& localVars) {
    auto createLocals = [&](auto& syntaxType) {
        auto& scope = symbol.as<Scope>();
        for (auto varSyntax : syntaxType.variables) {
            SmallVector<const LocalAssertionVarSymbol*> vars;
            LocalAssertionVarSymbol::fromSyntax(*context.scope, *varSyntax, vars);
            for (auto var : vars) {
                var->getDeclaredType()->forceResolveAt(context);
                if (!var->name.empty()) {
                    auto [it, inserted] = instance.localVars.emplace(var->name, var);
                    if (inserted) {
                        localVars.push_back(var);

                        // If value successfully inserted then check LRM 16.10 section restriction:
                        // "It's illegal to declare a local variable if it is a formal argument of
                        // a sequence declaration."
                        if (auto other = scope.find(var->name))
                            context.scope->reportNameConflict(*var, *other);
                    }
                    else {
                        context.scope->reportNameConflict(*var, *it->second);
                    }
                }
            }
        }
    };

    if (symbol.kind == SymbolKind::Sequence) {
        auto& sds = syntax.as<SequenceDeclarationSyntax>();
        createLocals(sds);

        auto& result = AssertionExpr::bind(*sds.seqExpr, context);
        result.requireSequence(context);

        if (outputLocalVarArgLoc &&
            result.checkNondegeneracy().status.has(NondegeneracyStatus::AdmitsEmpty)) {
            auto& diag = context.addDiag(diag::LocalVarOutputEmptyMatch,
                                         sds.seqExpr->sourceRange());
            diag << symbol.name;
            diag.addNote(diag::NoteDeclarationHere, outputLocalVarArgLoc);
        }

        return result;
    }
    else {
        auto& pds = syntax.as<PropertyDeclarationSyntax>();
        createLocals(pds);
        return AssertionExpr::bind(*pds.propertySpec, context);
    }
}